

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::doWalkFunction(I64ToI32Lowering *this,Function *func)

{
  code *pcVar1;
  uint uVar2;
  mapped_type mVar3;
  bool bVar4;
  Index IVar5;
  ulong uVar6;
  size_t sVar7;
  wasm *this_00;
  mapped_type *pmVar8;
  char *in_R8;
  Name n;
  Name NVar9;
  string_view sVar10;
  Type local_430;
  string_view local_428;
  Type local_410;
  wasm *local_408;
  size_t sStack_400;
  BasicType local_3ec;
  code *local_3e8;
  _func_Index_Function_ptr_Name_Type *builderFunc;
  Type paramType;
  Name highName;
  Name lowName;
  Index i;
  Index newIdx;
  Name local_380;
  Function *local_370;
  Function *oldFunc;
  Module temp;
  Function *func_local;
  I64ToI32Lowering *this_local;
  
  Flat::verifyFlatness(func);
  bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->builder);
  if (!bVar4) {
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getModule
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>)
    ;
    std::make_unique<wasm::Builder,wasm::Module&>((Module *)&temp.tagsMap._M_h._M_single_bucket);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator=
              (&this->builder,
               (unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &temp.tagsMap._M_h._M_single_bucket);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &temp.tagsMap._M_h._M_single_bucket);
  }
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&this->indexMap);
  std::
  unordered_map<wasm::Expression_*,_wasm::I64ToI32Lowering::TempVar,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>_>
  ::clear(&this->highBitVars);
  std::
  unordered_map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::clear(&this->freeTemps);
  Module::Module((Module *)&oldFunc);
  wasm::Name::Name(&local_380);
  NVar9.super_IString.str._M_str = in_R8;
  NVar9.super_IString.str._M_len = (size_t)local_380.super_IString.str._M_str;
  local_370 = wasm::ModuleUtils::copyFunction
                        ((ModuleUtils *)func,(Function *)&oldFunc,
                         (Module *)local_380.super_IString.str._M_len,NVar9);
  wasm::Type::Type((Type *)&i,none);
  Function::setParams(func,_i);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::clear(&func->vars);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::clear(&func->localNames);
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::clear(&func->localIndices);
  lowName.super_IString.str._M_str._4_4_ = 0;
  Names::ensureNames(local_370);
  lowName.super_IString.str._M_str._0_4_ = 0;
  while( true ) {
    uVar6 = (ulong)(uint)lowName.super_IString.str._M_str;
    sVar7 = Function::getNumLocals(local_370);
    if (sVar7 <= uVar6) {
      sVar7 = Function::getNumLocals(func);
      this->nextTemp = (Index)sVar7;
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::doWalkFunction
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,func);
      Module::~Module((Module *)&oldFunc);
      return;
    }
    bVar4 = Function::hasLocalName(local_370,(uint)lowName.super_IString.str._M_str);
    if (!bVar4) break;
    NVar9 = Function::getLocalName(local_370,(uint)lowName.super_IString.str._M_str);
    n.super_IString.str._M_str = NVar9.super_IString.str._M_str;
    this_00 = NVar9.super_IString.str._M_len;
    n.super_IString.str._M_len = (size_t)n.super_IString.str._M_str;
    paramType.id = (uintptr_t)this_00;
    lowName.super_IString.str._M_len = (size_t)n.super_IString.str._M_str;
    sVar10 = (string_view)makeHighName(this_00,n);
    builderFunc = (_func_Index_Function_ptr_Name_Type *)
                  Function::getLocalType(local_370,(uint)lowName.super_IString.str._M_str);
    uVar2 = (uint)lowName.super_IString.str._M_str;
    IVar5 = Function::getVarIndexBase(local_370);
    local_3e8 = Builder::addVar;
    if (uVar2 < IVar5) {
      local_3e8 = Builder::addParam;
    }
    local_3ec = i64;
    bVar4 = wasm::Type::operator==((Type *)&builderFunc,&local_3ec);
    pcVar1 = local_3e8;
    if (bVar4) {
      sStack_400 = lowName.super_IString.str._M_len;
      local_408 = this_00;
      wasm::Type::Type(&local_410,i32);
      (*pcVar1)(func,local_408,sStack_400,local_410.id);
      pcVar1 = local_3e8;
      local_428 = sVar10;
      wasm::Type::Type(&local_430,i32);
      (*pcVar1)(func,local_428._M_len,local_428._M_str,local_430.id);
      mVar3 = lowName.super_IString.str._M_str._4_4_;
      pmVar8 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->indexMap,(key_type *)&lowName.super_IString.str._M_str);
      *pmVar8 = mVar3;
      lowName.super_IString.str._M_str._4_4_ = lowName.super_IString.str._M_str._4_4_ + 2;
    }
    else {
      (*local_3e8)(func,this_00,lowName.super_IString.str._M_len,builderFunc);
      mVar3 = lowName.super_IString.str._M_str._4_4_;
      lowName.super_IString.str._M_str._4_4_ = lowName.super_IString.str._M_str._4_4_ + 1;
      pmVar8 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->indexMap,(key_type *)&lowName.super_IString.str._M_str);
      *pmVar8 = mVar3;
    }
    lowName.super_IString.str._M_str._0_4_ = (uint)lowName.super_IString.str._M_str + 1;
  }
  __assert_fail("oldFunc->hasLocalName(i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0xab,"void wasm::I64ToI32Lowering::doWalkFunction(Function *)");
}

Assistant:

void doWalkFunction(Function* func) {
    Flat::verifyFlatness(func);
    // create builder here if this is first entry to module for this object
    if (!builder) {
      builder = std::make_unique<Builder>(*getModule());
    }
    indexMap.clear();
    highBitVars.clear();
    freeTemps.clear();
    Module temp;
    auto* oldFunc = ModuleUtils::copyFunction(func, temp);
    func->setParams(Type::none);
    func->vars.clear();
    func->localNames.clear();
    func->localIndices.clear();
    Index newIdx = 0;
    Names::ensureNames(oldFunc);
    for (Index i = 0; i < oldFunc->getNumLocals(); ++i) {
      assert(oldFunc->hasLocalName(i));
      Name lowName = oldFunc->getLocalName(i);
      Name highName = makeHighName(lowName);
      Type paramType = oldFunc->getLocalType(i);
      auto builderFunc =
        (i < oldFunc->getVarIndexBase())
          ? Builder::addParam
          : static_cast<Index (*)(Function*, Name, Type)>(Builder::addVar);
      if (paramType == Type::i64) {
        builderFunc(func, lowName, Type::i32);
        builderFunc(func, highName, Type::i32);
        indexMap[i] = newIdx;
        newIdx += 2;
      } else {
        builderFunc(func, lowName, paramType);
        indexMap[i] = newIdx++;
      }
    }
    nextTemp = func->getNumLocals();
    PostWalker<I64ToI32Lowering>::doWalkFunction(func);
  }